

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

ArenaAllocator * __thiscall
DListBase<Memory::ArenaAllocator,RealCount>::
PrependNode<Memory::HeapAllocator,char16_t_const*,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void(*)()>
          (DListBase<Memory::ArenaAllocator,RealCount> *this,HeapAllocator *allocator,
          char16_t *param1,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param2,_func_void *param3)

{
  HeapAllocator *alloc;
  DListNode<Memory::ArenaAllocator> *this_00;
  DListNodeBase<Memory::ArenaAllocator> **ppDVar1;
  TrackAllocData local_68;
  DListNode<Memory::ArenaAllocator> *local_40;
  Node *newNode;
  _func_void *param3_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *param2_local;
  char16_t *param1_local;
  HeapAllocator *allocator_local;
  DListBase<Memory::ArenaAllocator,_RealCount> *this_local;
  
  newNode = (Node *)param3;
  param3_local = (_func_void *)param2;
  param2_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *)param1;
  param1_local = (char16_t *)allocator;
  allocator_local = (HeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&DListNode<Memory::ArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x131);
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,&local_68);
  this_00 = (DListNode<Memory::ArenaAllocator> *)new<Memory::HeapAllocator>(0x90,alloc,0x350bd0);
  DListNode<Memory::ArenaAllocator>::
  DListNode<char16_t_const*,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void(*)()>
            (this_00,(char16_t *)param2_local,
             (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)param3_local,(_func_void *)newNode);
  if (this_00 == (DListNode<Memory::ArenaAllocator> *)0x0) {
    this_local = (DListBase<Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  else {
    local_40 = this_00;
    ppDVar1 = DListNodeBase<Memory::ArenaAllocator>::Next
                        ((DListNodeBase<Memory::ArenaAllocator> *)this);
    DListBase<Memory::ArenaAllocator,_RealCount>::InsertNodeBefore
              (*ppDVar1,&local_40->super_DListNodeBase<Memory::ArenaAllocator>);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::ArenaAllocator,_RealCount> *)&local_40->data;
  }
  return (ArenaAllocator *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }